

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Error doCdataSection(XML_Parser parser,ENCODING *enc,char **startPtr,char *end,char **nextPtr,
                        XML_Bool haveMore)

{
  int iVar1;
  char *extraout_RDX;
  char **ppcVar2;
  _func_int_ENCODING_ptr_char_ptr_char_ptr *p_Stack_78;
  XML_Convert_Result convert_res;
  ICHAR *dataPtr;
  XML_CharacterDataHandler charDataHandler;
  XML_Char c;
  char **ppcStack_60;
  int tok;
  char *next;
  char **eventEndPP;
  char **eventPP;
  char *s;
  char **ppcStack_38;
  XML_Bool haveMore_local;
  char **nextPtr_local;
  char *end_local;
  char **startPtr_local;
  ENCODING *enc_local;
  XML_Parser parser_local;
  
  eventPP = (char **)*startPtr;
  if (enc == parser->m_encoding) {
    eventEndPP = &parser->m_eventPtr;
    *eventEndPP = (char *)eventPP;
    next = (char *)&parser->m_eventEndPtr;
  }
  else {
    eventEndPP = &parser->m_openInternalEntities->internalEventPtr;
    next = (char *)&parser->m_openInternalEntities->internalEventEndPtr;
  }
  *eventEndPP = (char *)eventPP;
  *startPtr = (char *)0x0;
  s._7_1_ = haveMore;
  ppcStack_38 = nextPtr;
  nextPtr_local = (char **)end;
  end_local = (char *)startPtr;
  startPtr_local = (char **)enc;
  enc_local = (ENCODING *)parser;
  do {
    ppcVar2 = eventPP;
    charDataHandler._4_4_ =
         (*(code *)startPtr_local[2])(startPtr_local,eventPP,nextPtr_local,&stack0xffffffffffffffa0)
    ;
    *(char ***)next = ppcStack_60;
    switch(charDataHandler._4_4_) {
    case 0:
      *eventEndPP = (char *)ppcStack_60;
      return XML_ERROR_INVALID_TOKEN;
    case 6:
      dataPtr = (ICHAR *)enc_local->utf16Convert;
      if ((_func_XML_Convert_Result_ENCODING_ptr_char_ptr_ptr_char_ptr_unsigned_short_ptr_ptr_unsigned_short_ptr
           *)dataPtr ==
          (_func_XML_Convert_Result_ENCODING_ptr_char_ptr_ptr_char_ptr_unsigned_short_ptr_ptr_unsigned_short_ptr
           *)0x0) {
        if (enc_local[1].literalScanners[0] != (SCANNER)0x0) {
          reportDefault((XML_Parser)enc_local,(ENCODING *)startPtr_local,(char *)eventPP,
                        (char *)ppcStack_60);
        }
      }
      else if (*(char *)((long)startPtr_local + 0x84) == '\0') {
        while( true ) {
          p_Stack_78 = enc_local->predefinedEntityName;
          nextPtr = (char **)enc_local->updatePosition;
          iVar1 = (*(code *)startPtr_local[0xe])
                            (startPtr_local,&eventPP,ppcStack_60,&stack0xffffffffffffff88);
          *(char ***)next = ppcStack_60;
          (*(code *)dataPtr)(enc_local->scanners[1],enc_local->predefinedEntityName,
                             (long)p_Stack_78 - (long)enc_local->predefinedEntityName & 0xffffffff);
          if ((iVar1 == 0) || (iVar1 == 1)) break;
          *eventEndPP = (char *)eventPP;
        }
      }
      else {
        (*(code *)dataPtr)((ENCODING *)enc_local->scanners[1],eventPP,
                           (char *)((ulong)((long)ppcStack_60 - (long)eventPP) & 0xffffffff),
                           (unsigned_short **)((long)ppcStack_60 - (long)eventPP),
                           (unsigned_short *)nextPtr);
      }
      break;
    case 7:
      if (enc_local->utf16Convert ==
          (_func_XML_Convert_Result_ENCODING_ptr_char_ptr_ptr_char_ptr_unsigned_short_ptr_ptr_unsigned_short_ptr
           *)0x0) {
        if (enc_local[1].literalScanners[0] != (SCANNER)0x0) {
          reportDefault((XML_Parser)enc_local,(ENCODING *)startPtr_local,(char *)eventPP,
                        (char *)ppcStack_60);
        }
      }
      else {
        charDataHandler._3_1_ = 10;
        (*enc_local->utf16Convert)
                  ((ENCODING *)enc_local->scanners[1],(char **)((long)&charDataHandler + 3),
                   (char *)0x1,(unsigned_short **)enc_local,(unsigned_short *)nextPtr);
      }
      break;
    case 0x28:
      if (enc_local[1].scanners[2] == (SCANNER)0x0) {
        if (enc_local[1].literalScanners[0] != (SCANNER)0x0) {
          reportDefault((XML_Parser)enc_local,(ENCODING *)startPtr_local,(char *)eventPP,
                        (char *)ppcStack_60);
        }
      }
      else {
        (*enc_local[1].scanners[2])
                  ((ENCODING *)enc_local->scanners[1],(char *)ppcVar2,extraout_RDX,
                   (char **)enc_local);
      }
      *(char ***)end_local = ppcStack_60;
      *ppcStack_38 = (char *)ppcStack_60;
      if (*(int *)&enc_local[6].getAtts == 2) {
        return XML_ERROR_ABORTED;
      }
      return XML_ERROR_NONE;
    case 0xfffffffc:
    case 0xffffffff:
      if (s._7_1_ != '\0') {
        *ppcStack_38 = (char *)eventPP;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_UNCLOSED_CDATA_SECTION;
    default:
      *eventEndPP = (char *)ppcStack_60;
      return XML_ERROR_UNEXPECTED_STATE;
    case 0xfffffffe:
      if (s._7_1_ != '\0') {
        *ppcStack_38 = (char *)eventPP;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_PARTIAL_CHAR;
    }
    eventPP = ppcStack_60;
    *eventEndPP = (char *)ppcStack_60;
    if (*(int *)&enc_local[6].getAtts == 2) {
      return XML_ERROR_ABORTED;
    }
  } while (*(int *)&enc_local[6].getAtts != 3);
  *ppcStack_38 = (char *)ppcStack_60;
  return XML_ERROR_NONE;
}

Assistant:

static enum XML_Error
doCdataSection(XML_Parser parser,
               const ENCODING *enc,
               const char **startPtr,
               const char *end,
               const char **nextPtr,
               XML_Bool haveMore)
{
  const char *s = *startPtr;
  const char **eventPP;
  const char **eventEndPP;
  if (enc == encoding) {
    eventPP = &eventPtr;
    *eventPP = s;
    eventEndPP = &eventEndPtr;
  }
  else {
    eventPP = &(openInternalEntities->internalEventPtr);
    eventEndPP = &(openInternalEntities->internalEventEndPtr);
  }
  *eventPP = s;
  *startPtr = NULL;

  for (;;) {
    const char *next;
    int tok = XmlCdataSectionTok(enc, s, end, &next);
    *eventEndPP = next;
    switch (tok) {
    case XML_TOK_CDATA_SECT_CLOSE:
      if (endCdataSectionHandler)
        endCdataSectionHandler(handlerArg);
#if 0
      /* see comment under XML_TOK_CDATA_SECT_OPEN */
      else if (characterDataHandler)
        characterDataHandler(handlerArg, dataBuf, 0);
#endif
      else if (defaultHandler)
        reportDefault(parser, enc, s, next);
      *startPtr = next;
      *nextPtr = next;
      if (ps_parsing == XML_FINISHED)
        return XML_ERROR_ABORTED;
      else
        return XML_ERROR_NONE;
    case XML_TOK_DATA_NEWLINE:
      if (characterDataHandler) {
        XML_Char c = 0xA;
        characterDataHandler(handlerArg, &c, 1);
      }
      else if (defaultHandler)
        reportDefault(parser, enc, s, next);
      break;
    case XML_TOK_DATA_CHARS:
      {
        XML_CharacterDataHandler charDataHandler = characterDataHandler;
        if (charDataHandler) {
          if (MUST_CONVERT(enc, s)) {
            for (;;) {
              ICHAR *dataPtr = (ICHAR *)dataBuf;
              const enum XML_Convert_Result convert_res = XmlConvert(enc, &s, next, &dataPtr, (ICHAR *)dataBufEnd);
              *eventEndPP = next;
              charDataHandler(handlerArg, dataBuf,
                              (int)(dataPtr - (ICHAR *)dataBuf));
              if ((convert_res == XML_CONVERT_COMPLETED) || (convert_res == XML_CONVERT_INPUT_INCOMPLETE))
                break;
              *eventPP = s;
            }
          }
          else
            charDataHandler(handlerArg,
                            (XML_Char *)s,
                            (int)((XML_Char *)next - (XML_Char *)s));
        }
        else if (defaultHandler)
          reportDefault(parser, enc, s, next);
      }
      break;
    case XML_TOK_INVALID:
      *eventPP = next;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_PARTIAL_CHAR:
      if (haveMore) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_PARTIAL_CHAR;
    case XML_TOK_PARTIAL:
    case XML_TOK_NONE:
      if (haveMore) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_UNCLOSED_CDATA_SECTION;
    default:
      *eventPP = next;
      return XML_ERROR_UNEXPECTED_STATE;
    }

    *eventPP = s = next;
    switch (ps_parsing) {
    case XML_SUSPENDED:
      *nextPtr = next;
      return XML_ERROR_NONE;
    case XML_FINISHED:
      return XML_ERROR_ABORTED;
    default: ;
    }
  }
  /* not reached */
}